

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O0

uint8_t seek2ch(uint8_t **pos,uint8_t *limit,uint8_t ch)

{
  uint8_t *puVar1;
  uint8_t *tmp;
  uint8_t ch_local;
  uint8_t *limit_local;
  uint8_t **pos_local;
  
  if ((*pos < limit) && (**pos != ch)) {
    puVar1 = (uint8_t *)memchr(*pos,(uint)ch,(long)limit - (long)*pos);
    if (puVar1 == (uint8_t *)0x0) {
      *pos = limit;
      pos_local._7_1_ = '\0';
    }
    else {
      *pos = puVar1;
      pos_local._7_1_ = '\x01';
    }
  }
  else {
    pos_local._7_1_ = '\0';
  }
  return pos_local._7_1_;
}

Assistant:

inline static uint8_t seek2ch(uint8_t **pos, uint8_t *const limit, uint8_t ch) {
  /* This is library based alternative that is sometimes slower  */
  if (*pos >= limit || **pos == ch) {
    return 0;
  }
  uint8_t *tmp = memchr(*pos, ch, limit - (*pos));
  if (tmp) {
    *pos = tmp;
#if HTTP1_PARSER_CONVERT_EOL2NUL
    *tmp = 0;
#endif
    return 1;
  }
  *pos = limit;
  return 0;
}